

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O3

void coda_mem_type_delete(coda_dynamic_type *type)

{
  coda_backend cVar1;
  coda_dynamic_type *pcVar2;
  long lVar3;
  coda_type *__ptr;
  long lVar4;
  
  if (type == (coda_dynamic_type *)0x0) {
    __assert_fail("type != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                  ,0x2a,"void coda_mem_type_delete(coda_dynamic_type *)");
  }
  if (type->backend != coda_backend_memory) {
    __assert_fail("type->backend == coda_backend_memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                  ,0x2b,"void coda_mem_type_delete(coda_dynamic_type *)");
  }
  cVar1 = type[1].backend;
  if (cVar1 == 3) {
    if (*(coda_dynamic_type **)(type + 2) != (coda_dynamic_type *)0x0) {
      coda_dynamic_type_delete(*(coda_dynamic_type **)(type + 2));
    }
    goto LAB_0011c2df;
  }
  if (cVar1 == coda_backend_binary) {
    __ptr = type[2].definition;
    if (__ptr == (coda_type *)0x0) goto LAB_0011c2df;
    lVar3 = *(long *)(type + 2);
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        pcVar2 = *(coda_dynamic_type **)(&(type[2].definition)->format + lVar4 * 2);
        if (pcVar2 != (coda_dynamic_type *)0x0) {
          coda_dynamic_type_delete(pcVar2);
          lVar3 = *(long *)(type + 2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < lVar3);
      goto LAB_0011c2c6;
    }
  }
  else {
    if ((cVar1 != coda_backend_ascii) || (__ptr = type[2].definition, __ptr == (coda_type *)0x0))
    goto LAB_0011c2df;
    lVar3 = *(long *)(type + 2);
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        pcVar2 = *(coda_dynamic_type **)(&(type[2].definition)->format + lVar4 * 2);
        if (pcVar2 != (coda_dynamic_type *)0x0) {
          coda_dynamic_type_delete(pcVar2);
          lVar3 = *(long *)(type + 2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < lVar3);
LAB_0011c2c6:
      __ptr = type[2].definition;
    }
  }
  free(__ptr);
LAB_0011c2df:
  if (type[1].definition != (coda_type *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)type[1].definition);
  }
  if (type->definition != (coda_type *)0x0) {
    coda_type_release(type->definition);
  }
  free(type);
  return;
}

Assistant:

void coda_mem_type_delete(coda_dynamic_type *type)
{
    int i;

    assert(type != NULL);
    assert(type->backend == coda_backend_memory);

    switch (((coda_mem_type *)type)->tag)
    {
        case tag_mem_record:
            if (((coda_mem_record *)type)->field_type != NULL)
            {
                for (i = 0; i < ((coda_mem_record *)type)->num_fields; i++)
                {
                    if (((coda_mem_record *)type)->field_type[i] != NULL)
                    {
                        coda_dynamic_type_delete(((coda_mem_record *)type)->field_type[i]);
                    }
                }
                free(((coda_mem_record *)type)->field_type);
            }
            break;
        case tag_mem_array:
            if (((coda_mem_array *)type)->element != NULL)
            {
                for (i = 0; i < ((coda_mem_array *)type)->num_elements; i++)
                {
                    if (((coda_mem_array *)type)->element[i] != NULL)
                    {
                        coda_dynamic_type_delete(((coda_mem_array *)type)->element[i]);
                    }
                }
                free(((coda_mem_array *)type)->element);
            }
            break;
        case tag_mem_data:
            break;
        case tag_mem_special:
            if (((coda_mem_special *)type)->base_type != NULL)
            {
                coda_dynamic_type_delete(((coda_mem_special *)type)->base_type);
            }
            break;
    }
    if (((coda_mem_type *)type)->attributes != NULL)
    {
        coda_dynamic_type_delete(((coda_mem_type *)type)->attributes);
    }
    if (type->definition != NULL)
    {
        coda_type_release((coda_type *)type->definition);
    }
    free(type);
}